

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlUTF8Strndup(xmlChar *utf,int len)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  int i;
  xmlChar *ret;
  int len_local;
  xmlChar *utf_local;
  
  if ((utf == (xmlChar *)0x0) || (len < 0)) {
    utf_local = (xmlChar *)0x0;
  }
  else {
    iVar2 = xmlUTF8Strsize(utf,len);
    utf_local = (xmlChar *)(*xmlMallocAtomic)((long)(iVar2 + 1));
    if (utf_local == (xmlChar *)0x0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"malloc of %ld byte failed\n",(long)(len + 1));
      utf_local = (xmlChar *)0x0;
    }
    else {
      memcpy(utf_local,utf,(long)iVar2);
      utf_local[iVar2] = '\0';
    }
  }
  return utf_local;
}

Assistant:

xmlChar *
xmlUTF8Strndup(const xmlChar *utf, int len) {
    xmlChar *ret;
    int i;

    if ((utf == NULL) || (len < 0)) return(NULL);
    i = xmlUTF8Strsize(utf, len);
    ret = (xmlChar *) xmlMallocAtomic((i + 1) * sizeof(xmlChar));
    if (ret == NULL) {
        xmlGenericError(xmlGenericErrorContext,
                "malloc of %ld byte failed\n",
                (len + 1) * (long)sizeof(xmlChar));
        return(NULL);
    }
    memcpy(ret, utf, i * sizeof(xmlChar));
    ret[i] = 0;
    return(ret);
}